

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O0

int ixmlNamedNodeMap_addToNamedNodeMap(IXML_NamedNodeMap **nnMap,IXML_Node_conflict *add)

{
  IXML_NamedNodeMap *pIVar1;
  _IXML_NamedNodeMap *p_Var2;
  IXML_NamedNodeMap *newItem;
  IXML_NamedNodeMap *p;
  IXML_NamedNodeMap *traverse;
  IXML_Node_conflict *add_local;
  IXML_NamedNodeMap **nnMap_local;
  
  if (add != (IXML_Node_conflict *)0x0) {
    if (*nnMap == (IXML_NamedNodeMap *)0x0) {
      pIVar1 = (IXML_NamedNodeMap *)malloc(0x10);
      *nnMap = pIVar1;
      if (*nnMap == (IXML_NamedNodeMap *)0x0) {
        return 0x66;
      }
      ixmlNamedNodeMap_init(*nnMap);
    }
    if ((*nnMap)->nodeItem == (IXML_Node_conflict *)0x0) {
      (*nnMap)->nodeItem = add;
    }
    else {
      newItem = *nnMap;
      for (p = newItem; p != (IXML_NamedNodeMap *)0x0; p = p->next) {
        newItem = p;
      }
      p_Var2 = (_IXML_NamedNodeMap *)malloc(0x10);
      if (p_Var2 == (_IXML_NamedNodeMap *)0x0) {
        return 0x66;
      }
      newItem->next = p_Var2;
      p_Var2->nodeItem = add;
      p_Var2->next = (_IXML_NamedNodeMap *)0x0;
    }
  }
  return 0;
}

Assistant:

int ixmlNamedNodeMap_addToNamedNodeMap(
	IXML_NamedNodeMap **nnMap, IXML_Node *add)
{
	IXML_NamedNodeMap *traverse = NULL;
	IXML_NamedNodeMap *p = NULL;
	IXML_NamedNodeMap *newItem = NULL;

	if (add == NULL) {
		return IXML_SUCCESS;
	}

	if (*nnMap == NULL) {
		/* nodelist is empty */
		*nnMap = (IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (*nnMap == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		ixmlNamedNodeMap_init(*nnMap);
	}
	if ((*nnMap)->nodeItem == NULL) {
		(*nnMap)->nodeItem = add;
	} else {
		traverse = *nnMap;
		p = traverse;
		while (traverse != NULL) {
			p = traverse;
			traverse = traverse->next;
		}
		newItem =
			(IXML_NamedNodeMap *)malloc(sizeof(IXML_NamedNodeMap));
		if (newItem == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
		p->next = newItem;
		newItem->nodeItem = add;
		newItem->next = NULL;
	}

	return IXML_SUCCESS;
}